

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::val::ValidationState_t::GetBitWidth(ValidationState_t *this,uint32_t id)

{
  long *plVar1;
  uint32_t uVar2;
  const_iterator cVar3;
  uint32_t local_c;
  
  local_c = GetComponentType(this,id);
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_c);
  if ((cVar3.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (plVar1 = *(long **)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                ._M_cur + 0x10), plVar1 != (long *)0x0)) {
    if (*(ushort *)((long)plVar1 + 0x3a) - 0x15 < 2) {
      uVar2 = *(uint32_t *)(*plVar1 + 8);
    }
    else {
      uVar2 = 1;
      if (*(ushort *)((long)plVar1 + 0x3a) != 0x14) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x3a8,
                      "uint32_t spvtools::val::ValidationState_t::GetBitWidth(uint32_t) const");
      }
    }
    return uVar2;
  }
  __assert_fail("inst",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x3a0,"uint32_t spvtools::val::ValidationState_t::GetBitWidth(uint32_t) const");
}

Assistant:

uint32_t ValidationState_t::GetBitWidth(uint32_t id) const {
  const uint32_t component_type_id = GetComponentType(id);
  const Instruction* inst = FindDef(component_type_id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeFloat ||
      inst->opcode() == spv::Op::OpTypeInt)
    return inst->word(2);

  if (inst->opcode() == spv::Op::OpTypeBool) return 1;

  assert(0);
  return 0;
}